

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t * __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>
::shapeBegin(BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Plus<float,_float,_float>_>
             *this)

{
  size_t *psVar1;
  
  psVar1 = View<float,_true,_std::allocator<unsigned_long>_>::shapeBegin(this->e_);
  return psVar1;
}

Assistant:

const std::size_t* shapeBegin() const 
        { return e_.shapeBegin(); }